

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_by_extension(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_SIZE *data;
  int *piVar1;
  int iVar2;
  REF_INT RVar3;
  REF_GRID ref_grid;
  REF_NODE pRVar4;
  REF_GRID_conflict pRVar5;
  REF_CELL pRVar6;
  REF_INT *pRVar7;
  REF_FILEPOS RVar8;
  int iVar9;
  uint uVar10;
  REF_STATUS RVar11;
  size_t sVar12;
  FILE *pFVar13;
  REF_GEOM pRVar14;
  size_t sVar15;
  REF_BYTE *pRVar16;
  __off_t conn_offset;
  undefined8 uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  char *pcVar21;
  bool bVar22;
  double dVar23;
  REF_GEOM pRStackY_690;
  char letter;
  REF_BOOL available;
  REF_INT version;
  REF_GEOM local_658;
  REF_GRID_conflict local_650;
  uint local_644;
  REF_NODE local_640;
  REF_INT dim_1;
  REF_INT dim;
  char units [3];
  uint local_61c;
  int nqua2;
  int nqua;
  int ntri2;
  int ntri_int;
  int npyr;
  int npri;
  int nhex;
  int ntet_int;
  int boundary_patches;
  int cell_polynomial_order;
  int face_polynomial_order;
  int max_faces_per_cell;
  int max_nodes_per_cell;
  int max_nodes_per_face;
  int ncells;
  int nfaces;
  int nnodes;
  int refined;
  REF_INT keyword_code;
  undefined1 local_5c9;
  int precision;
  int meshes;
  int revision;
  int magic;
  REF_FILEPOS next_position;
  undefined1 local_598;
  char patch_type [17];
  char coordinate_system [7];
  REF_LONG ncell;
  double model_scale;
  REF_LONG nnode;
  undefined1 local_528;
  REF_FILEPOS key_pos [156];
  
  sVar12 = strlen(filename);
  if (sVar12 < 0xb) {
    if (sVar12 == 10) goto LAB_0019b6bb;
    if (6 < sVar12) goto LAB_0019b896;
    if (4 < sVar12) goto LAB_0019b8ae;
LAB_0019b8ca:
    printf("%s: %d: %s %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xd0c,
           "input file name extension unknown",filename);
    pcVar21 = "unknown file extension";
    pRStackY_690 = (REF_GEOM)0x1;
    uVar17 = 0xd0e;
    goto LAB_0019c016;
  }
  iVar9 = strcmp(filename + (sVar12 - 10),".lb8.ugrid");
  if (iVar9 == 0) {
    uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
    if (uVar10 == 0) {
      return 0;
    }
    pcVar21 = "lb8_ugrid failed";
    uVar17 = 0xcdf;
    goto LAB_0019b79a;
  }
LAB_0019b6bb:
  iVar9 = strcmp(filename + (sVar12 - 9),".b8.ugrid");
  if (iVar9 == 0) {
    uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
    if (uVar10 == 0) {
      return 0;
    }
    pcVar21 = "b8_ugrid failed";
    uVar17 = 0xce6;
    goto LAB_0019b79a;
  }
  if (sVar12 < 0xc) {
    if (sVar12 < 0xb) goto LAB_0019b896;
  }
  else {
    iVar9 = strcmp(filename + (sVar12 - 0xb),".lb8l.ugrid");
    if (iVar9 == 0) {
      uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
      if (uVar10 == 0) {
        return 0;
      }
      pcVar21 = "lb8_ugrid failed";
      uVar17 = 0xced;
      goto LAB_0019b79a;
    }
  }
  iVar9 = strcmp(filename + (sVar12 - 10),".b8l.ugrid");
  if (iVar9 == 0) {
    uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
    if (uVar10 == 0) {
      return 0;
    }
    pRStackY_690 = (REF_GEOM)(ulong)uVar10;
    pcVar21 = "b8_ugrid failed";
    uVar17 = 0xcf3;
    goto LAB_0019c016;
  }
  if (sVar12 < 0xd) {
    if (sVar12 < 0xc) goto LAB_0019b896;
  }
  else {
    iVar9 = strcmp(filename + (sVar12 - 0xc),".lb8.ugrid64");
    if (iVar9 == 0) {
      uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
      if (uVar10 == 0) {
        return 0;
      }
      pcVar21 = "lb8_ugrid failed";
      uVar17 = 0xcfa;
LAB_0019b79a:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17
             ,"ref_part_by_extension",(ulong)uVar10,pcVar21);
      return uVar10;
    }
  }
  iVar9 = strcmp(filename + (sVar12 - 0xb),".b8.ugrid64");
  if (iVar9 == 0) {
    uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
    if (uVar10 == 0) {
      return 0;
    }
    pRStackY_690 = (REF_GEOM)(ulong)uVar10;
    pcVar21 = "b8_ugrid failed";
    uVar17 = 0xd00;
    goto LAB_0019c016;
  }
LAB_0019b896:
  iVar9 = strcmp(filename + (sVar12 - 6),".meshb");
  if (iVar9 == 0) {
    next_position = -1;
    if (ref_mpi->id == 0) {
      uVar10 = ref_import_meshb_header(filename,&version,key_pos);
      if (uVar10 == 0) {
        pFVar13 = fopen(filename,"r");
        if (pFVar13 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          pcVar21 = "unable to open file";
          uVar17 = 0x2d2;
          goto LAB_0019bc98;
        }
        uVar10 = ref_import_meshb_jump((FILE *)pFVar13,version,key_pos,3,&available,&next_position);
        if (uVar10 == 0) {
          if (available == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x2d6,"ref_part_meshb","meshb missing dimension");
          }
          else {
            sVar12 = fread(&dim,4,1,pFVar13);
            if (sVar12 == 1) goto LAB_0019b92d;
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x2d7,"ref_part_meshb","dim",1,sVar12);
          }
          pRStackY_690 = (REF_GEOM)0x1;
          goto LAB_0019bff5;
        }
        pRStackY_690 = (REF_GEOM)(ulong)uVar10;
        pcVar21 = "jump";
        uVar17 = 0x2d5;
      }
      else {
        pRStackY_690 = (REF_GEOM)(ulong)uVar10;
        pcVar21 = "header";
        uVar17 = 0x2cd;
      }
    }
    else {
      pFVar13 = (FILE *)0x0;
LAB_0019b92d:
      uVar10 = ref_mpi_bcast(ref_mpi,&version,1,1);
      if (uVar10 == 0) {
        pRStackY_690 = (REF_GEOM)0x1;
        uVar10 = ref_mpi_bcast(ref_mpi,&dim,1,1);
        if (uVar10 == 0) {
          uVar10 = ref_grid_create(ref_grid_ptr,ref_mpi);
          if (uVar10 == 0) {
            pRVar5 = *ref_grid_ptr;
            pRVar4 = pRVar5->node;
            local_658 = pRVar5->geom;
            pRVar5->twod = (uint)(dim == 2);
            if (pRVar5->mpi->id == 0) {
              uVar10 = ref_import_meshb_jump
                                 ((FILE *)pFVar13,version,key_pos,4,&available,&next_position);
              if (uVar10 != 0) {
                pcVar21 = "jump";
                uVar17 = 0x2e5;
                goto LAB_0019bc00;
              }
              if (available == 0) {
                pcVar21 = "meshb missing vertex";
                uVar17 = 0x2e6;
                goto LAB_0019c35d;
              }
              RVar11 = ref_part_meshb_long((FILE *)pFVar13,version,&nnode);
              if (RVar11 != 0) {
                pcVar21 = "nnode";
                uVar17 = 0x2e7;
                goto LAB_0019ba15;
              }
            }
            uVar10 = ref_mpi_bcast(ref_mpi,&nnode,1,2);
            if (uVar10 == 0) {
              uVar10 = ref_part_node((FILE *)pFVar13,0,version,pRVar5->twod,pRVar4,nnode);
              sVar12 = next_position;
              if (uVar10 == 0) {
                local_650 = pRVar5;
                if ((pRVar5->mpi->id == 0) && (sVar15 = ftello(pFVar13), sVar12 != sVar15)) {
                  pcVar21 = "vertex file location";
                  uVar17 = 0x2ef;
                  goto LAB_0019c52d;
                }
                local_640 = pRVar4;
                for (lVar18 = 2; pRVar5 = local_650, lVar18 != 0x12; lVar18 = lVar18 + 1) {
                  pRVar6 = local_650->cell[lVar18 + -2];
                  if (local_650->mpi->id == 0) {
                    uVar10 = ref_cell_meshb_keyword(pRVar6,&keyword_code);
                    if (uVar10 != 0) {
                      pcVar21 = "kw";
                      uVar17 = 0x2f3;
                      goto LAB_0019ca3e;
                    }
                    uVar10 = ref_import_meshb_jump
                                       ((FILE *)pFVar13,version,key_pos,keyword_code,&available,
                                        &next_position);
                    if (uVar10 != 0) {
                      pcVar21 = "jump";
                      uVar17 = 0x2f6;
                      goto LAB_0019ca3e;
                    }
                    if (available != 0) {
                      RVar11 = ref_part_meshb_long((FILE *)pFVar13,version,&ncell);
                      if (RVar11 != 0) {
                        pcVar21 = "ncell";
                        pRStackY_690 = (REF_GEOM)0x1;
                        uVar17 = 0x2f8;
                        goto LAB_0019ba15;
                      }
                    }
                  }
                  uVar10 = ref_mpi_bcast(ref_mpi,&available,1,1);
                  if (uVar10 != 0) {
                    pcVar21 = "bcast";
                    uVar17 = 0x2fc;
                    goto LAB_0019ca3e;
                  }
                  if (available != 0) {
                    uVar10 = ref_mpi_bcast(ref_mpi,&ncell,1,2);
                    if (uVar10 != 0) {
                      pcVar21 = "bcast";
                      uVar17 = 0x2fe;
                      goto LAB_0019ca3e;
                    }
                    uVar10 = ref_part_meshb_cell(pRVar6,ncell,local_640,nnode,version,0,
                                                 (FILE *)pFVar13);
                    sVar12 = next_position;
                    if (uVar10 != 0) {
                      pcVar21 = "part cell";
                      uVar17 = 0x301;
                      goto LAB_0019bc00;
                    }
                    if ((local_650->mpi->id == 0) && (sVar15 = ftello(pFVar13), sVar12 != sVar15)) {
                      pcVar21 = "cell file location";
                      uVar17 = 0x303;
                      goto LAB_0019c52d;
                    }
                  }
                }
                iVar9 = 0;
LAB_0019c3e4:
                iVar2 = pRVar5->mpi->id;
                if (iVar9 == 3) goto LAB_0019c7c2;
                if (iVar2 != 0) {
LAB_0019c447:
                  uVar10 = ref_mpi_bcast(ref_mpi,&available,1,1);
                  if (uVar10 != 0) {
                    pcVar21 = "bcast";
                    uVar17 = 0x312;
                    goto LAB_0019ca3e;
                  }
                  if (available != 0) {
                    uVar10 = ref_mpi_bcast(ref_mpi,patch_type,1,2);
                    if (uVar10 != 0) {
                      pcVar21 = "bcast";
                      uVar17 = 0x314;
                      goto LAB_0019ca3e;
                    }
                    uVar10 = ref_part_meshb_geom_bcast
                                       (local_658,patch_type._0_8_,iVar9,local_640,version,
                                        (FILE *)pFVar13);
                    sVar12 = next_position;
                    if (uVar10 != 0) {
                      pcVar21 = "part geom";
                      uVar17 = 0x317;
                      goto LAB_0019ca3e;
                    }
                    if ((pRVar5->mpi->id == 0) && (sVar15 = ftello(pFVar13), sVar12 != sVar15)) {
                      pcVar21 = "end location";
                      uVar17 = 0x319;
                      goto LAB_0019c52d;
                    }
                  }
                  iVar9 = iVar9 + 1;
                  goto LAB_0019c3e4;
                }
                uVar10 = ref_import_meshb_jump
                                   ((FILE *)pFVar13,version,key_pos,iVar9 + 0x28,&available,
                                    &next_position);
                if (uVar10 == 0) {
                  if (available != 0) {
                    RVar11 = ref_part_meshb_long((FILE *)pFVar13,version,(REF_LONG *)patch_type);
                    if (RVar11 != 0) {
                      pcVar21 = "ngeom";
                      pRStackY_690 = (REF_GEOM)0x1;
                      uVar17 = 0x30e;
                      goto LAB_0019ba15;
                    }
                  }
                  goto LAB_0019c447;
                }
                pcVar21 = "jump";
                uVar17 = 0x30c;
LAB_0019ca3e:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar17,"ref_part_meshb",(ulong)uVar10,pcVar21);
                pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                goto LAB_0019bff5;
              }
              pcVar21 = "part node";
              uVar17 = 0x2ed;
            }
            else {
              pcVar21 = "bcast";
              uVar17 = 0x2ea;
            }
          }
          else {
            pcVar21 = "create grid";
            uVar17 = 0x2dc;
          }
        }
        else {
          pcVar21 = "bcast";
          uVar17 = 0x2db;
        }
LAB_0019bc00:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar17,"ref_part_meshb",(ulong)uVar10,pcVar21);
        pRStackY_690 = (REF_GEOM)(ulong)uVar10;
        goto LAB_0019bff5;
      }
      pRStackY_690 = (REF_GEOM)(ulong)uVar10;
      pcVar21 = "bcast";
      uVar17 = 0x2da;
    }
LAB_0019ba15:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
           "ref_part_meshb",pRStackY_690,pcVar21);
    goto LAB_0019bff5;
  }
LAB_0019b8ae:
  iVar9 = strcmp(filename + (sVar12 - 4),".avm");
  if (iVar9 != 0) goto LAB_0019b8ca;
  uVar10 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar10 == 0) {
    ref_grid = *ref_grid_ptr;
    pRVar4 = ref_grid->node;
    if (ref_mpi->id != 0) {
      pFVar13 = (FILE *)0x0;
      lVar18 = _version;
LAB_0019ba3a:
      _version = lVar18;
      uVar10 = ref_mpi_bcast(ref_grid->mpi,&dim_1,1,1);
      if (uVar10 == 0) {
        ref_grid->twod = (uint)(dim_1 == 2);
        uVar10 = ref_mpi_bcast(ref_grid->mpi,&ref_grid->coordinate_system,1,1);
        if (uVar10 == 0) {
          uVar10 = ref_mpi_bcast(ref_grid->mpi,&ref_grid->unit,1,1);
          if (uVar10 == 0) {
            uVar10 = ref_mpi_bcast(ref_grid->mpi,ref_grid->references,7,3);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_bcast(ref_grid->mpi,&version,1,2);
              if (uVar10 == 0) {
                uVar10 = ref_mpi_bcast(ref_grid->mpi,&available,1,2);
                if (uVar10 == 0) {
                  pRStackY_690 = (REF_GEOM)0x1;
                  uVar10 = ref_mpi_bcast(ref_grid->mpi,&dim,1,2);
                  if (uVar10 == 0) {
                    uVar10 = ref_part_node((FILE *)pFVar13,0,0,0,pRVar4,_version);
                    if (uVar10 == 0) {
                      if (ref_grid->twod == 0) {
                        pRVar6 = ref_grid->cell[3];
                        iVar9 = 0;
                        uVar10 = ref_part_meshb_cell(pRVar6,(REF_LONG)_available,pRVar4,_version,0,0
                                                     ,(FILE *)pFVar13);
                        if (uVar10 == 0) {
                          for (; iVar9 < pRVar6->max; iVar9 = iVar9 + 1) {
                            lVar18 = (long)iVar9 * (long)pRVar6->size_per;
                            if (pRVar6->c2n[lVar18] != -1) {
                              piVar1 = pRVar6->c2n + (long)(int)lVar18 + (long)pRVar6->node_per;
                              *piVar1 = -*piVar1;
                            }
                          }
                          goto LAB_0019cbad;
                        }
                        pcVar21 = "read tri";
                        uVar17 = 0x6e9;
                      }
                      else {
                        pRVar6 = ref_grid->cell[0];
                        iVar9 = 0;
                        uVar10 = ref_part_meshb_cell(pRVar6,(REF_LONG)_available,pRVar4,_version,0,1
                                                     ,(FILE *)pFVar13);
                        if (uVar10 == 0) {
                          for (; iVar9 < pRVar6->max; iVar9 = iVar9 + 1) {
                            lVar18 = (long)iVar9 * (long)pRVar6->size_per;
                            if (pRVar6->c2n[lVar18] != -1) {
                              piVar1 = pRVar6->c2n + (long)(int)lVar18 + (long)pRVar6->node_per;
                              *piVar1 = -*piVar1;
                            }
                          }
LAB_0019cbad:
                          if (ref_grid->twod == 0) {
                            if (ref_grid->mpi->id == 0) {
                              conn_offset = ftello(pFVar13);
                            }
                            else {
                              conn_offset = 0;
                            }
                            uVar10 = ref_part_bin_ugrid_cell
                                               (ref_grid->cell[8],(REF_LONG)_dim,pRVar4,_version,
                                                (FILE *)pFVar13,conn_offset,0,0,0);
                            if (uVar10 != 0) {
                              pcVar21 = "read tet";
                              uVar17 = 0x709;
                              goto LAB_0019c7b1;
                            }
                          }
                          else {
                            pRVar6 = ref_grid->cell[3];
                            iVar9 = 0;
                            uVar10 = ref_part_meshb_cell(pRVar6,(REF_LONG)_dim,pRVar4,_version,0,0,
                                                         (FILE *)pFVar13);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x6f8,"ref_part_avm",(ulong)uVar10,"read tri");
                              pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                              goto LAB_0019b9af;
                            }
                            for (; iVar9 < pRVar6->max; iVar9 = iVar9 + 1) {
                              pRVar7 = pRVar6->c2n;
                              lVar18 = (long)pRVar6->size_per * (long)iVar9;
                              if (pRVar7[lVar18] != -1) {
                                RVar3 = pRVar7[lVar18 + 2];
                                pRVar7[lVar18 + 2] = pRVar7[lVar18 + 1];
                                pRVar7[(long)pRVar6->size_per * (long)iVar9 + 1] = RVar3;
                              }
                            }
                          }
                          if ((ref_grid->mpi->id != 0) || (iVar9 = fclose(pFVar13), iVar9 == 0)) {
                            return 0;
                          }
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x70c,"ref_part_avm","close file",0,(long)iVar9);
                          goto LAB_0019b9af;
                        }
                        pcVar21 = "read edg as tri";
                        uVar17 = 0x6dc;
                      }
                      pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                      goto LAB_0019b9a8;
                    }
                    pcVar21 = "part node";
                    uVar17 = 0x6d2;
                  }
                  else {
                    pcVar21 = "bcast";
                    uVar17 = 0x6cb;
                  }
LAB_0019c7b1:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar17,"ref_part_avm",(ulong)uVar10,pcVar21);
                  pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                  goto LAB_0019b9af;
                }
                pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                pcVar21 = "bcast";
                uVar17 = 0x6ca;
              }
              else {
                pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                pcVar21 = "bcast";
                uVar17 = 0x6c9;
              }
            }
            else {
              pRStackY_690 = (REF_GEOM)(ulong)uVar10;
              pcVar21 = "reference";
              uVar17 = 0x6c7;
            }
          }
          else {
            pRStackY_690 = (REF_GEOM)(ulong)uVar10;
            pcVar21 = "unit";
            uVar17 = 0x6c4;
          }
        }
        else {
          pRStackY_690 = (REF_GEOM)(ulong)uVar10;
          pcVar21 = "coordinate_system";
          uVar17 = 0x6c1;
        }
      }
      else {
        pRStackY_690 = (REF_GEOM)(ulong)uVar10;
        pcVar21 = "dim";
        uVar17 = 0x6bc;
      }
      goto LAB_0019b9a8;
    }
    pFVar13 = fopen(filename,"r");
    if (pFVar13 == (FILE *)0x0) {
      pRStackY_690 = (REF_GEOM)0x2;
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x60c,
             "ref_part_avm","unable to open file");
    }
    else {
      iVar9 = 6;
      while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
        pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
        if (pRVar14 != (REF_GEOM)0x1) {
          pcVar21 = "letter";
          pRStackY_690 = (REF_GEOM)0x1;
          uVar17 = 0x60f;
          goto LAB_0019cad3;
        }
        putchar((int)letter);
      }
      putchar(10);
      pRVar14 = (REF_GEOM)fread(&magic,4,1,pFVar13);
      if (pRVar14 == (REF_GEOM)0x1) {
        pRVar14 = (REF_GEOM)(long)magic;
        printf("%d magic\n",(ulong)(uint)magic);
        if (pRVar14 != (REF_GEOM)0x1) {
          pcVar21 = "magic";
          pRStackY_690 = (REF_GEOM)0x1;
          uVar17 = 0x615;
          goto LAB_0019cad3;
        }
        pRVar14 = (REF_GEOM)fread(&revision,4,1,pFVar13);
        if (pRVar14 != (REF_GEOM)0x1) {
          pcVar21 = "revision";
          pRStackY_690 = (REF_GEOM)0x1;
          uVar17 = 0x616;
          goto LAB_0019cad3;
        }
        pRVar14 = (REF_GEOM)(long)revision;
        printf("%d revision\n",(ulong)(uint)revision);
        if (pRVar14 != (REF_GEOM)0x2) {
          pcVar21 = "revision";
          pRStackY_690 = (REF_GEOM)0x2;
          uVar17 = 0x618;
          goto LAB_0019cad3;
        }
        pRVar14 = (REF_GEOM)fread(&meshes,4,1,pFVar13);
        if (pRVar14 != (REF_GEOM)0x1) {
          pcVar21 = "meshes";
          pRStackY_690 = (REF_GEOM)0x1;
          uVar17 = 0x619;
          goto LAB_0019cad3;
        }
        pRVar14 = (REF_GEOM)(long)meshes;
        printf("%d meshes\n",(ulong)(uint)meshes);
        if (pRVar14 != (REF_GEOM)0x1) {
          pcVar21 = "meshes";
          pRStackY_690 = (REF_GEOM)0x1;
          uVar17 = 0x61b;
          goto LAB_0019cad3;
        }
        local_644 = 0x80;
        iVar9 = 0x80;
        while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
          pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
          if (pRVar14 != (REF_GEOM)0x1) {
            pcVar21 = "letter";
            pRStackY_690 = (REF_GEOM)0x1;
            uVar17 = 0x61e;
            goto LAB_0019cad3;
          }
          putchar((int)letter);
        }
        putchar(10);
        pRVar14 = (REF_GEOM)fread(&precision,4,1,pFVar13);
        if (pRVar14 != (REF_GEOM)0x1) {
          pcVar21 = "precision";
          pRStackY_690 = (REF_GEOM)0x1;
          uVar17 = 0x622;
          goto LAB_0019cad3;
        }
        pRVar14 = (REF_GEOM)(long)precision;
        printf("%d precision\n",(ulong)(uint)precision);
        if (pRVar14 != (REF_GEOM)0x2) {
          pcVar21 = "precision";
          pRStackY_690 = (REF_GEOM)0x2;
          uVar17 = 0x624;
          goto LAB_0019cad3;
        }
        pRVar14 = (REF_GEOM)fread(&dim_1,4,1,pFVar13);
        RVar3 = dim_1;
        if (pRVar14 != (REF_GEOM)0x1) {
          pcVar21 = "dim";
          pRStackY_690 = (REF_GEOM)0x1;
          uVar17 = 0x625;
          goto LAB_0019cad3;
        }
        printf("%d dim\n",(ulong)(uint)dim_1);
        if ((RVar3 & 0xfffffffeU) == 2) {
          pRVar14 = (REF_GEOM)fread(&local_644,4,1,pFVar13);
          uVar10 = local_644;
          if (pRVar14 == (REF_GEOM)0x1) {
            printf("%d description length\n",(ulong)local_644);
            uVar20 = 0;
            if (0 < (int)uVar10) {
              uVar20 = uVar10;
            }
            while (bVar22 = uVar20 != 0, uVar20 = uVar20 - 1, bVar22) {
              pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
              if (pRVar14 != (REF_GEOM)0x1) {
                pcVar21 = "letter";
                pRStackY_690 = (REF_GEOM)0x1;
                uVar17 = 0x62b;
                goto LAB_0019cad3;
              }
              putchar((int)letter);
            }
            putchar(10);
            local_644 = 0x80;
            iVar9 = 0x80;
            while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
              pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
              if (pRVar14 != (REF_GEOM)0x1) {
                pcVar21 = "letter";
                pRStackY_690 = (REF_GEOM)0x1;
                uVar17 = 0x632;
                goto LAB_0019cad3;
              }
              putchar((int)letter);
            }
            putchar(10);
            pRVar14 = (REF_GEOM)fread(&keyword_code,1,7,pFVar13);
            if (pRVar14 == (REF_GEOM)0x7) {
              local_5c9 = 0;
              printf("%s",&keyword_code);
              iVar9 = strcmp("unstruc",(char *)&keyword_code);
              if (iVar9 != 0) {
                pRVar14 = (REF_GEOM)(long)iVar9;
                pcVar21 = "mesh type";
                uVar17 = 0x639;
                goto LAB_0019d0b5;
              }
              iVar9 = 0x79;
              while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
                pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
                if (pRVar14 != (REF_GEOM)0x1) {
                  pcVar21 = "letter";
                  pRStackY_690 = (REF_GEOM)0x1;
                  uVar17 = 0x63c;
                  goto LAB_0019cad3;
                }
                putchar((int)letter);
              }
              putchar(10);
              iVar9 = 0x80;
              while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
                pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
                if (pRVar14 != (REF_GEOM)0x1) {
                  pcVar21 = "letter";
                  pRStackY_690 = (REF_GEOM)0x1;
                  uVar17 = 0x643;
                  goto LAB_0019cad3;
                }
                putchar((int)letter);
              }
              putchar(10);
              pRVar14 = (REF_GEOM)fread(coordinate_system,1,6,pFVar13);
              if (pRVar14 == (REF_GEOM)0x6) {
                coordinate_system[6] = '\0';
                printf("%s",coordinate_system);
                uVar10 = ref_grid_parse_coordinate_system(ref_grid,coordinate_system);
                if (uVar10 != 0) {
                  pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                  pcVar21 = "parse coordinate_system";
                  uVar17 = 0x64c;
                  goto LAB_0019b9a8;
                }
                iVar9 = 0x7a;
                while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
                  pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
                  if (pRVar14 != (REF_GEOM)0x1) {
                    pcVar21 = "letter";
                    pRStackY_690 = (REF_GEOM)0x1;
                    uVar17 = 0x64f;
                    goto LAB_0019cad3;
                  }
                  putchar((int)letter);
                }
                putchar(10);
                pRVar14 = (REF_GEOM)fread(&model_scale,8,1,pFVar13);
                if (pRVar14 == (REF_GEOM)0x1) {
                  local_658 = (REF_GEOM)model_scale;
                  printf("%f model_scale\n");
                  dVar23 = 1.0 - (double)local_658;
                  if (dVar23 <= -dVar23) {
                    dVar23 = -dVar23;
                  }
                  if (1e-12 < dVar23) {
                    printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",
                           0x3ff0000000000000,local_658,dVar23,0x3d719799812dea11,
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x655,"ref_part_avm","model_scale");
                    goto LAB_0019cada;
                  }
                  pRVar14 = (REF_GEOM)fread(units,1,2,pFVar13);
                  if (pRVar14 == (REF_GEOM)0x2) {
                    units[2] = '\0';
                    printf("%s",units);
                    uVar10 = ref_grid_parse_unit(ref_grid,units);
                    if (uVar10 != 0) {
                      pRStackY_690 = (REF_GEOM)(ulong)uVar10;
                      pcVar21 = "parse unit";
                      uVar17 = 0x659;
                      goto LAB_0019b9a8;
                    }
                    iVar9 = 0x7e;
                    while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
                      pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
                      if (pRVar14 != (REF_GEOM)0x1) {
                        pcVar21 = "letter";
                        pRStackY_690 = (REF_GEOM)0x1;
                        uVar17 = 0x65c;
                        goto LAB_0019cad3;
                      }
                      putchar((int)letter);
                    }
                    putchar(10);
                    pRVar14 = (REF_GEOM)fread(key_pos,8,7,pFVar13);
                    if (pRVar14 == (REF_GEOM)0x7) {
                      for (uVar19 = 0; uVar19 != 7; uVar19 = uVar19 + 1) {
                        ref_grid->references[uVar19] = (REF_DBL)key_pos[uVar19];
                        printf("%f reference %d\n",uVar19 & 0xffffffff);
                      }
                      iVar9 = 0x80;
                      while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
                        pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
                        if (pRVar14 != (REF_GEOM)0x1) {
                          pcVar21 = "letter";
                          pRStackY_690 = (REF_GEOM)0x1;
                          uVar17 = 0x668;
                          goto LAB_0019cad3;
                        }
                        putchar((int)letter);
                      }
                      putchar(10);
                      pRVar14 = (REF_GEOM)fread(&refined,4,1,pFVar13);
                      if (pRVar14 == (REF_GEOM)0x1) {
                        pRVar14 = (REF_GEOM)(long)refined;
                        printf("%d refined\n",(ulong)(uint)refined);
                        if (pRVar14 != (REF_GEOM)0x0) {
                          pcVar21 = "refined";
                          uVar17 = 0x66e;
                          goto LAB_0019d0b5;
                        }
                        local_644 = 0x80;
                        iVar9 = 0x80;
                        while (bVar22 = iVar9 != 0, iVar9 = iVar9 + -1, bVar22) {
                          pRVar14 = (REF_GEOM)fread(&letter,1,1,pFVar13);
                          if (pRVar14 != (REF_GEOM)0x1) {
                            pcVar21 = "letter";
                            pRStackY_690 = (REF_GEOM)0x1;
                            uVar17 = 0x672;
                            goto LAB_0019cad3;
                          }
                          putchar((int)letter);
                        }
                        putchar(10);
                        pRVar14 = (REF_GEOM)fread(&nnodes,4,1,pFVar13);
                        if (pRVar14 == (REF_GEOM)0x1) {
                          pRVar14 = (REF_GEOM)fread(&nfaces,4,1,pFVar13);
                          if (pRVar14 == (REF_GEOM)0x1) {
                            pRVar14 = (REF_GEOM)fread(&ncells,4,1,pFVar13);
                            if (pRVar14 == (REF_GEOM)0x1) {
                              printf("%d nnodes %d nfaces %d ncells\n",(ulong)(uint)nnodes,
                                     (ulong)(uint)nfaces,(ulong)(uint)ncells);
                              pRVar14 = (REF_GEOM)fread(&max_nodes_per_face,4,1,pFVar13);
                              if (pRVar14 == (REF_GEOM)0x1) {
                                pRVar14 = (REF_GEOM)fread(&max_nodes_per_cell,4,1,pFVar13);
                                if (pRVar14 == (REF_GEOM)0x1) {
                                  pRVar14 = (REF_GEOM)fread(&max_faces_per_cell,4,1,pFVar13);
                                  if (pRVar14 == (REF_GEOM)0x1) {
                                    printf("%d max_nodes_per_face %d max_faces_per_face %d max_faces_per_cell\n"
                                           ,(ulong)(uint)max_nodes_per_face,
                                           (ulong)(uint)max_nodes_per_cell,
                                           (ulong)(uint)max_faces_per_cell);
                                    pRVar14 = (REF_GEOM)fread(&next_position,1,0x20,pFVar13);
                                    if (pRVar14 == (REF_GEOM)0x20) {
                                      local_598 = 0;
                                      puts((char *)&next_position);
                                      iVar9 = strcmp("uniform",(char *)&next_position);
                                      if (iVar9 != 0) {
                                        pRVar14 = (REF_GEOM)(long)iVar9;
                                        pcVar21 = "element_scheme";
                                        uVar17 = 0x688;
                                        goto LAB_0019d0b5;
                                      }
                                      pRVar14 = (REF_GEOM)fread(&face_polynomial_order,4,1,pFVar13);
                                      if (pRVar14 == (REF_GEOM)0x1) {
                                        pRVar14 = (REF_GEOM)
                                                  fread(&cell_polynomial_order,4,1,pFVar13);
                                        if (pRVar14 == (REF_GEOM)0x1) {
                                          pRVar14 = (REF_GEOM)(long)face_polynomial_order;
                                          local_658 = (REF_GEOM)
                                                      CONCAT44(local_658._4_4_,cell_polynomial_order
                                                              );
                                          printf("%d face_polynomial_order %d cell_polynomial_order\n"
                                                 ,(ulong)(uint)face_polynomial_order);
                                          if (pRVar14 == (REF_GEOM)0x1) {
                                            if ((int)local_658 == 1) {
                                              pRVar14 = (REF_GEOM)
                                                        fread(&boundary_patches,4,1,pFVar13);
                                              if (pRVar14 == (REF_GEOM)0x1) {
                                                printf("%d boundary_patches\n");
                                                pRVar14 = (REF_GEOM)fread(&nhex,4,1,pFVar13);
                                                if (pRVar14 == (REF_GEOM)0x1) {
                                                  pRVar14 = (REF_GEOM)fread(&ntet_int,4,1,pFVar13);
                                                  if (pRVar14 == (REF_GEOM)0x1) {
                                                    local_658 = (REF_GEOM)(long)ntet_int;
                                                    _dim = local_658;
                                                    pRVar14 = (REF_GEOM)fread(&npri,4,1,pFVar13);
                                                    if (pRVar14 == (REF_GEOM)0x1) {
                                                      pRVar14 = (REF_GEOM)fread(&npyr,4,1,pFVar13);
                                                      if (pRVar14 == (REF_GEOM)0x1) {
                                                        pRVar14 = (REF_GEOM)(long)nhex;
                                                        local_640 = (REF_NODE)
                                                                    CONCAT44(local_640._4_4_,npri);
                                                        local_650 = (REF_GRID_conflict)
                                                                    CONCAT44(local_650._4_4_,npyr);
                                                        printf("%d nhex %d ntet %d npri %d npyr\n",
                                                               (ulong)(uint)nhex,local_658);
                                                        if (pRVar14 == (REF_GEOM)0x0) {
                                                          if ((int)local_640 == 0) {
                                                            if ((int)local_650 == 0) {
                                                              if (ncells == (int)local_658) {
                                                                pRVar14 = (REF_GEOM)
                                                                          fread(&ntri_int,4,1,
                                                                                pFVar13);
                                                                if (pRVar14 == (REF_GEOM)0x1) {
                                                                  _available = (REF_GEOM)
                                                                               (long)ntri_int;
                                                                  local_658 = _available;
                                                                  pRVar14 = (REF_GEOM)
                                                                            fread(&ntri2,4,1,pFVar13
                                                                                 );
                                                                  if (pRVar14 == (REF_GEOM)0x1) {
                                                                    pRVar14 = (REF_GEOM)
                                                                              fread(&nqua,4,1,
                                                                                    pFVar13);
                                                                    if (pRVar14 == (REF_GEOM)0x1) {
                                                                      pRVar14 = (REF_GEOM)
                                                                                fread(&nqua2,4,1,
                                                                                      pFVar13);
                                                                      if (pRVar14 == (REF_GEOM)0x1)
                                                                      {
                                                                        local_650 = (
                                                  REF_GRID_conflict)CONCAT44(local_650._4_4_,ntri2);
                                                  printf("%d ntri %d ntri %d nqua %d nqua\n",
                                                         local_658,(ulong)(uint)ntri2,
                                                         (ulong)(uint)nqua,(ulong)(uint)nqua2);
                                                  if (_available == (REF_GEOM)(long)(int)local_650)
                                                  {
                                                    if (nqua == 0) {
                                                      if (nqua2 == 0) {
                                                        pRVar14 = (REF_GEOM)
                                                                  fread(&ncell,4,5,pFVar13);
                                                        if (pRVar14 != (REF_GEOM)0x5) {
                                                          pcVar21 = "zeros";
                                                          pRStackY_690 = (REF_GEOM)0x5;
                                                          uVar17 = 0x6ac;
                                                          goto LAB_0019cad3;
                                                        }
                                                        lVar18 = 0;
                                                        do {
                                                          if (lVar18 == 5) {
                                                            if (boundary_patches < 1) {
                                                              boundary_patches = 0;
                                                            }
                                                            goto LAB_0019e0b9;
                                                          }
                                                          pRVar14 = (REF_GEOM)
                                                                    (long)*(int *)((long)&ncell +
                                                                                  lVar18 * 4);
                                                          lVar18 = lVar18 + 1;
                                                        } while (pRVar14 == (REF_GEOM)0x0);
                                                        pcVar21 = "zeros not zero";
                                                        uVar17 = 0x6ae;
                                                      }
                                                      else {
                                                        pRVar14 = (REF_GEOM)(long)nqua2;
                                                        pcVar21 = "nquad mismatch";
                                                        uVar17 = 0x6ab;
                                                      }
                                                    }
                                                    else {
                                                      pRVar14 = (REF_GEOM)(long)nqua;
                                                      pcVar21 = "cant do quad";
                                                      uVar17 = 0x6aa;
                                                    }
                                                    goto LAB_0019d0b5;
                                                  }
                                                  pcVar21 = "ntri mismatch";
                                                  uVar17 = 0x6a9;
                                                  pRStackY_690 = _available;
                                                  pRVar14 = (REF_GEOM)(long)(int)local_650;
                                                  }
                                                  else {
                                                    pcVar21 = "nqua2";
                                                    pRStackY_690 = (REF_GEOM)0x1;
                                                    uVar17 = 0x6a6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar21 = "nqua";
                                                    pRStackY_690 = (REF_GEOM)0x1;
                                                    uVar17 = 0x6a5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar21 = "ntri2";
                                                    pRStackY_690 = (REF_GEOM)0x1;
                                                    uVar17 = 0x6a4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar21 = "ntri_int";
                                                    pRStackY_690 = (REF_GEOM)0x1;
                                                    uVar17 = 0x6a2;
                                                  }
                                                  }
                                                  else {
                                                    pRStackY_690 = (REF_GEOM)(long)ncells;
                                                    pcVar21 = "ncells does not match ntet";
                                                    uVar17 = 0x6a1;
                                                    pRVar14 = local_658;
                                                  }
                                                  goto LAB_0019cad3;
                                                  }
                                                  pRVar14 = (REF_GEOM)(long)(int)local_650;
                                                  pcVar21 = "cant do pyramid";
                                                  uVar17 = 0x6a0;
                                                  }
                                                  else {
                                                    pRVar14 = (REF_GEOM)(long)(int)local_640;
                                                    pcVar21 = "cant do prism";
                                                    uVar17 = 0x69f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar21 = "cant do hex";
                                                    uVar17 = 0x69e;
                                                  }
LAB_0019d0b5:
                                                  pRStackY_690 = (REF_GEOM)0x0;
                                                  }
                                                  else {
                                                    pcVar21 = "npyr";
                                                    pRStackY_690 = (REF_GEOM)0x1;
                                                    uVar17 = 0x69b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar21 = "npri";
                                                    pRStackY_690 = (REF_GEOM)0x1;
                                                    uVar17 = 0x69a;
                                                  }
                                                  }
                                                  else {
                                                    pcVar21 = "ntet_int";
                                                    pRStackY_690 = (REF_GEOM)0x1;
                                                    uVar17 = 0x698;
                                                  }
                                                }
                                                else {
                                                  pcVar21 = "nhex";
                                                  pRStackY_690 = (REF_GEOM)0x1;
                                                  uVar17 = 0x697;
                                                }
                                              }
                                              else {
                                                pcVar21 = "boundary_patches";
                                                pRStackY_690 = (REF_GEOM)0x1;
                                                uVar17 = 0x695;
                                              }
                                            }
                                            else {
                                              pRVar14 = (REF_GEOM)(long)(int)local_658;
                                              pcVar21 = "cell_polynomial_order";
                                              pRStackY_690 = (REF_GEOM)0x1;
                                              uVar17 = 0x693;
                                            }
                                          }
                                          else {
                                            pcVar21 = "face_polynomial_order";
                                            pRStackY_690 = (REF_GEOM)0x1;
                                            uVar17 = 0x692;
                                          }
                                        }
                                        else {
                                          pcVar21 = "cell_polynomial_order";
                                          pRStackY_690 = (REF_GEOM)0x1;
                                          uVar17 = 0x68e;
                                        }
                                      }
                                      else {
                                        pcVar21 = "face_polynomial_order";
                                        pRStackY_690 = (REF_GEOM)0x1;
                                        uVar17 = 0x68b;
                                      }
                                    }
                                    else {
                                      pcVar21 = "element_scheme";
                                      pRStackY_690 = (REF_GEOM)0x20;
                                      uVar17 = 0x685;
                                    }
                                  }
                                  else {
                                    pcVar21 = "max_faces_per_cell";
                                    pRStackY_690 = (REF_GEOM)0x1;
                                    uVar17 = 0x680;
                                  }
                                }
                                else {
                                  pcVar21 = "max_nodes_per_cell";
                                  pRStackY_690 = (REF_GEOM)0x1;
                                  uVar17 = 0x67e;
                                }
                              }
                              else {
                                pcVar21 = "max_nodes_per_face";
                                pRStackY_690 = (REF_GEOM)0x1;
                                uVar17 = 0x67c;
                              }
                            }
                            else {
                              pcVar21 = "ncells";
                              pRStackY_690 = (REF_GEOM)0x1;
                              uVar17 = 0x678;
                            }
                          }
                          else {
                            pcVar21 = "nfaces";
                            pRStackY_690 = (REF_GEOM)0x1;
                            uVar17 = 0x677;
                          }
                        }
                        else {
                          pcVar21 = "nnodes";
                          pRStackY_690 = (REF_GEOM)0x1;
                          uVar17 = 0x676;
                        }
                      }
                      else {
                        pcVar21 = "refined";
                        pRStackY_690 = (REF_GEOM)0x1;
                        uVar17 = 0x66c;
                      }
                    }
                    else {
                      pcVar21 = "letter";
                      pRStackY_690 = (REF_GEOM)0x7;
                      uVar17 = 0x660;
                    }
                  }
                  else {
                    pcVar21 = "units";
                    pRStackY_690 = (REF_GEOM)0x2;
                    uVar17 = 0x656;
                  }
                }
                else {
                  pcVar21 = "model_scale";
                  pRStackY_690 = (REF_GEOM)0x1;
                  uVar17 = 0x653;
                }
              }
              else {
                pcVar21 = "coordinate_system";
                pRStackY_690 = (REF_GEOM)0x6;
                uVar17 = 0x648;
              }
            }
            else {
              pcVar21 = "letter";
              pRStackY_690 = (REF_GEOM)0x7;
              uVar17 = 0x636;
            }
          }
          else {
            pcVar21 = "length";
            pRStackY_690 = (REF_GEOM)0x1;
            uVar17 = 0x628;
          }
          goto LAB_0019cad3;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x627,"ref_part_avm","dim");
      }
      else {
        pcVar21 = "magic";
        pRStackY_690 = (REF_GEOM)0x1;
        uVar17 = 0x613;
LAB_0019cad3:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar17,"ref_part_avm",pcVar21,pRStackY_690,pRVar14);
      }
LAB_0019cada:
      pRStackY_690 = (REF_GEOM)0x1;
    }
  }
  else {
    pRStackY_690 = (REF_GEOM)(ulong)uVar10;
    pcVar21 = "create grid";
    uVar17 = 0x5ed;
LAB_0019b9a8:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
           "ref_part_avm",pRStackY_690,pcVar21);
  }
LAB_0019b9af:
  pcVar21 = "avm failed";
  uVar17 = 0xd09;
LAB_0019c016:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
         "ref_part_by_extension",pRStackY_690,pcVar21);
  return (REF_STATUS)pRStackY_690;
LAB_0019c7c2:
  if (iVar2 == 0) {
    uVar10 = ref_import_meshb_jump((FILE *)pFVar13,version,key_pos,0x7e,&available,&next_position);
    if (uVar10 != 0) {
      pcVar21 = "jump";
      uVar17 = 0x321;
      goto LAB_0019bc00;
    }
    if (available == 0) goto LAB_0019c7ca;
    RVar11 = ref_part_meshb_size((FILE *)pFVar13,version,&local_658->cad_data_size);
    pRVar14 = local_658;
    if (RVar11 != 0) {
      pcVar21 = "cad data size";
      pRStackY_690 = (REF_GEOM)0x1;
      uVar17 = 0x325;
      goto LAB_0019ba15;
    }
    free(local_658->cad_data);
    sVar12 = pRVar14->cad_data_size;
    pRVar16 = (REF_BYTE *)malloc(sVar12);
    pRVar14->cad_data = pRVar16;
    if (pRVar16 == (REF_BYTE *)0x0) {
      pcVar21 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
      uVar17 = 0x32b;
LAB_0019bc98:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17
             ,"ref_part_meshb",pcVar21);
      pRStackY_690 = (REF_GEOM)0x2;
      goto LAB_0019bff5;
    }
    sVar15 = fread(pRVar16,1,sVar12,pFVar13);
    RVar8 = next_position;
    if (sVar12 == sVar15) {
      sVar15 = ftello(pFVar13);
      if (RVar8 == sVar15) goto LAB_0019c7ca;
      pcVar21 = "end location";
      uVar17 = 0x330;
      sVar12 = RVar8;
    }
    else {
      pcVar21 = "cad_data";
      uVar17 = 0x32f;
    }
LAB_0019c52d:
    pRStackY_690 = (REF_GEOM)0x1;
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
           "ref_part_meshb",pcVar21,sVar12,sVar15);
  }
  else {
LAB_0019c7ca:
    uVar10 = ref_mpi_bcast(ref_mpi,&available,1,1);
    if (uVar10 != 0) {
      pRStackY_690 = (REF_GEOM)(ulong)uVar10;
      pcVar21 = "bcast";
      uVar17 = 0x333;
      goto LAB_0019ba15;
    }
    if (available == 0) {
LAB_0019cf87:
      uVar10 = ref_geom_ghost(local_658,local_640);
      if (uVar10 == 0) {
        uVar10 = ref_node_ghost_real(local_640);
        if (uVar10 == 0) {
          uVar10 = ref_grid_inward_boundary_orientation(local_650);
          if (uVar10 == 0) {
            if (local_650->mpi->id != 0) {
              return 0;
            }
            fclose(pFVar13);
            return 0;
          }
          pRStackY_690 = (REF_GEOM)(ulong)uVar10;
          pcVar21 = "inward boundary orientation";
          uVar17 = 0x347;
        }
        else {
          pRStackY_690 = (REF_GEOM)(ulong)uVar10;
          pcVar21 = "ghost real";
          uVar17 = 0x344;
        }
      }
      else {
        pRStackY_690 = (REF_GEOM)(ulong)uVar10;
        pcVar21 = "fill geom ghosts";
        uVar17 = 0x343;
      }
      goto LAB_0019ba15;
    }
    data = &local_658->cad_data_size;
    pRStackY_690 = (REF_GEOM)0x2;
    uVar10 = ref_mpi_bcast(ref_mpi,data,1,2);
    if (uVar10 != 0) {
      pcVar21 = "bcast";
      uVar17 = 0x337;
      goto LAB_0019bc00;
    }
    pRVar16 = local_658->cad_data;
    if (local_650->mpi->id == 0) {
      sVar12 = *data;
LAB_0019cf4e:
      uVar10 = ref_mpi_bcast(ref_mpi,pRVar16,(REF_INT)sVar12,4);
      if (uVar10 != 0) {
        pRStackY_690 = (REF_GEOM)(ulong)uVar10;
        pcVar21 = "bcast";
        uVar17 = 0x340;
        goto LAB_0019ba15;
      }
      goto LAB_0019cf87;
    }
    free(pRVar16);
    pRVar14 = local_658;
    sVar12 = local_658->cad_data_size;
    pRVar16 = (REF_BYTE *)malloc(sVar12);
    pRVar14->cad_data = pRVar16;
    if (pRVar16 != (REF_BYTE *)0x0) goto LAB_0019cf4e;
    pcVar21 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
    uVar17 = 0x33c;
LAB_0019c35d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
           "ref_part_meshb",pcVar21);
  }
LAB_0019bff5:
  pcVar21 = "meshb failed";
  uVar17 = 0xd05;
  goto LAB_0019c016;
LAB_0019e0b9:
  lVar18 = (long)nnodes;
  if (boundary_patches == 0) goto LAB_0019ba3a;
  pRVar14 = (REF_GEOM)fread(&nnode,1,0x20,pFVar13);
  if (pRVar14 != (REF_GEOM)0x20) {
    pcVar21 = "patch_label";
    pRStackY_690 = (REF_GEOM)0x20;
    uVar17 = 0x6b1;
    goto LAB_0019cad3;
  }
  local_528 = 0;
  pRVar14 = (REF_GEOM)fread(patch_type,1,0x10,pFVar13);
  if (pRVar14 != (REF_GEOM)0x10) {
    pcVar21 = "patch_type";
    pRStackY_690 = (REF_GEOM)0x10;
    uVar17 = 0x6b3;
    goto LAB_0019cad3;
  }
  patch_type[0x10] = '\0';
  pRVar14 = (REF_GEOM)fread(&local_61c,4,1,pFVar13);
  if (pRVar14 != (REF_GEOM)0x1) {
    pcVar21 = "patch_id";
    pRStackY_690 = (REF_GEOM)0x1;
    uVar17 = 0x6b5;
    goto LAB_0019cad3;
  }
  printf("%s %s %d -> %d\n",&nnode,patch_type,(ulong)local_61c,(ulong)-local_61c);
  boundary_patches = boundary_patches + -1;
  goto LAB_0019e0b9;
}

Assistant:

REF_FCN REF_STATUS ref_part_by_extension(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_FALSE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                           REF_FALSE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_part_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_avm(ref_grid_ptr, ref_mpi, filename), "avm failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  RSS(REF_FAILURE, "unknown file extension");
  return REF_FAILURE;
}